

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void destroyShellObjects(_GLFWwindow *window)

{
  long in_RDI;
  
  destroyFallbackDecorations((_GLFWwindow *)0xc198ae);
  if (*(long *)(in_RDI + 0x3d8) != 0) {
    (*_glfw.wl.libdecor.libdecor_frame_unref_)(*(libdecor_frame **)(in_RDI + 0x3d8));
  }
  if (*(long *)(in_RDI + 0x3c8) != 0) {
    zxdg_toplevel_decoration_v1_destroy((zxdg_toplevel_decoration_v1 *)window);
  }
  if (*(long *)(in_RDI + 0x3c0) != 0) {
    xdg_toplevel_destroy((xdg_toplevel *)window);
  }
  if (*(long *)(in_RDI + 0x3b8) != 0) {
    xdg_surface_destroy((xdg_surface *)window);
  }
  *(undefined8 *)(in_RDI + 0x3d8) = 0;
  *(undefined8 *)(in_RDI + 0x3c8) = 0;
  *(undefined4 *)(in_RDI + 0x3d0) = 0;
  *(undefined8 *)(in_RDI + 0x3c0) = 0;
  *(undefined8 *)(in_RDI + 0x3b8) = 0;
  return;
}

Assistant:

static void destroyShellObjects(_GLFWwindow* window)
{
    destroyFallbackDecorations(window);

    if (window->wl.libdecor.frame)
        libdecor_frame_unref(window->wl.libdecor.frame);

    if (window->wl.xdg.decoration)
        zxdg_toplevel_decoration_v1_destroy(window->wl.xdg.decoration);

    if (window->wl.xdg.toplevel)
        xdg_toplevel_destroy(window->wl.xdg.toplevel);

    if (window->wl.xdg.surface)
        xdg_surface_destroy(window->wl.xdg.surface);

    window->wl.libdecor.frame = NULL;
    window->wl.xdg.decoration = NULL;
    window->wl.xdg.decorationMode = 0;
    window->wl.xdg.toplevel = NULL;
    window->wl.xdg.surface = NULL;
}